

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentDiagnosticReport.h
# Opt level: O0

char * lscpp::protocol::to_string(DocumentDiagnosticReportKind kind)

{
  char *pcStack_10;
  DocumentDiagnosticReportKind kind_local;
  
  if (kind == Full) {
    pcStack_10 = "full";
  }
  else {
    if (kind != Unchanged) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/include/lscpp/protocol/DocumentDiagnosticReport.h"
                    ,0x2d,"const char *lscpp::protocol::to_string(DocumentDiagnosticReportKind)");
    }
    pcStack_10 = "unchanged";
  }
  return pcStack_10;
}

Assistant:

inline constexpr const char *to_string(DocumentDiagnosticReportKind kind) {
  switch (kind) {
  case DocumentDiagnosticReportKind::Full:
    return "full";
  case DocumentDiagnosticReportKind::Unchanged:
    return "unchanged";
  default:
    assert(false); /*unreachable*/
  }
}